

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Geometry *this;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  StackItemT<embree::NodeRefPtr<4>_> SVar14;
  StackItemT<embree::NodeRefPtr<4>_> SVar15;
  StackItemT<embree::NodeRefPtr<4>_> SVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  bool bVar22;
  byte bVar23;
  bool bVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  byte bVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vfloat<4> tNear;
  undefined1 local_1048 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  }
  pSVar28 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar54._4_4_ = fVar1;
  auVar54._0_4_ = fVar1;
  auVar54._8_4_ = fVar1;
  auVar54._12_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar55._4_4_ = fVar2;
  auVar55._0_4_ = fVar2;
  auVar55._8_4_ = fVar2;
  auVar55._12_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar56._4_4_ = fVar3;
  auVar56._0_4_ = fVar3;
  auVar56._8_4_ = fVar3;
  auVar56._12_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar33._4_4_ = uVar4;
  auVar33._0_4_ = uVar4;
  auVar33._8_4_ = uVar4;
  auVar33._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar37._4_4_ = uVar4;
  auVar37._0_4_ = uVar4;
  auVar37._8_4_ = uVar4;
  auVar37._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar35._4_4_ = uVar4;
  auVar35._0_4_ = uVar4;
  auVar35._8_4_ = uVar4;
  auVar35._12_4_ = uVar4;
  bVar24 = false;
  do {
    auVar17 = vsubps_avx(auVar54,auVar33);
    fVar10 = auVar33._0_4_;
    fVar11 = auVar33._4_4_;
    fVar12 = auVar33._8_4_;
    fVar13 = auVar33._12_4_;
    auVar33 = vsubps_avx(auVar55,auVar37);
    auVar18 = vsubps_avx(auVar56,auVar35);
    auVar38._0_4_ = fVar3 + auVar35._0_4_;
    auVar38._4_4_ = fVar3 + auVar35._4_4_;
    auVar38._8_4_ = fVar3 + auVar35._8_4_;
    auVar38._12_4_ = fVar3 + auVar35._12_4_;
    auVar57._0_4_ = fVar10 * fVar10;
    auVar57._4_4_ = fVar11 * fVar11;
    auVar57._8_4_ = fVar12 * fVar12;
    auVar57._12_4_ = fVar13 * fVar13;
LAB_00b6ba80:
    do {
      do {
        if (pSVar28 == stack) {
          return bVar24;
        }
        pSVar21 = pSVar28 + -1;
        pSVar28 = pSVar28 + -1;
      } while ((float)local_1048._0_4_ < (float)pSVar21->dist);
      uVar31 = (pSVar28->ptr).ptr;
LAB_00b6ba9e:
      uVar26 = (uint)uVar31;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar31 & 8) != 0) goto LAB_00b6be8e;
        uVar25 = uVar31 & 0xfffffffffffffff0;
        fVar5 = query->time;
        auVar34._4_4_ = fVar5;
        auVar34._0_4_ = fVar5;
        auVar34._8_4_ = fVar5;
        auVar34._12_4_ = fVar5;
        auVar43._0_4_ = fVar5 * *(float *)(uVar25 + 0x80) + *(float *)(uVar25 + 0x20);
        auVar43._4_4_ = fVar5 * *(float *)(uVar25 + 0x84) + *(float *)(uVar25 + 0x24);
        auVar43._8_4_ = fVar5 * *(float *)(uVar25 + 0x88) + *(float *)(uVar25 + 0x28);
        auVar43._12_4_ = fVar5 * *(float *)(uVar25 + 0x8c) + *(float *)(uVar25 + 0x2c);
        auVar46._0_4_ = fVar5 * *(float *)(uVar25 + 0xa0) + *(float *)(uVar25 + 0x40);
        auVar46._4_4_ = fVar5 * *(float *)(uVar25 + 0xa4) + *(float *)(uVar25 + 0x44);
        auVar46._8_4_ = fVar5 * *(float *)(uVar25 + 0xa8) + *(float *)(uVar25 + 0x48);
        auVar46._12_4_ = fVar5 * *(float *)(uVar25 + 0xac) + *(float *)(uVar25 + 0x4c);
        auVar40._0_4_ = fVar5 * *(float *)(uVar25 + 0xc0) + *(float *)(uVar25 + 0x60);
        auVar40._4_4_ = fVar5 * *(float *)(uVar25 + 0xc4) + *(float *)(uVar25 + 100);
        auVar40._8_4_ = fVar5 * *(float *)(uVar25 + 200) + *(float *)(uVar25 + 0x68);
        auVar40._12_4_ = fVar5 * *(float *)(uVar25 + 0xcc) + *(float *)(uVar25 + 0x6c);
        auVar48._0_4_ = fVar5 * *(float *)(uVar25 + 0x90) + *(float *)(uVar25 + 0x30);
        auVar48._4_4_ = fVar5 * *(float *)(uVar25 + 0x94) + *(float *)(uVar25 + 0x34);
        auVar48._8_4_ = fVar5 * *(float *)(uVar25 + 0x98) + *(float *)(uVar25 + 0x38);
        auVar48._12_4_ = fVar5 * *(float *)(uVar25 + 0x9c) + *(float *)(uVar25 + 0x3c);
        auVar51._0_4_ = fVar5 * *(float *)(uVar25 + 0xb0) + *(float *)(uVar25 + 0x50);
        auVar51._4_4_ = fVar5 * *(float *)(uVar25 + 0xb4) + *(float *)(uVar25 + 0x54);
        auVar51._8_4_ = fVar5 * *(float *)(uVar25 + 0xb8) + *(float *)(uVar25 + 0x58);
        auVar51._12_4_ = fVar5 * *(float *)(uVar25 + 0xbc) + *(float *)(uVar25 + 0x5c);
        auVar53._0_4_ = fVar5 * *(float *)(uVar25 + 0xd0) + *(float *)(uVar25 + 0x70);
        auVar53._4_4_ = fVar5 * *(float *)(uVar25 + 0xd4) + *(float *)(uVar25 + 0x74);
        auVar53._8_4_ = fVar5 * *(float *)(uVar25 + 0xd8) + *(float *)(uVar25 + 0x78);
        auVar53._12_4_ = fVar5 * *(float *)(uVar25 + 0xdc) + *(float *)(uVar25 + 0x7c);
        auVar35 = vmaxps_avx(auVar54,auVar43);
        auVar35 = vminps_avx(auVar35,auVar48);
        auVar19 = vsubps_avx(auVar35,auVar54);
        auVar35 = vmaxps_avx(auVar55,auVar46);
        auVar35 = vminps_avx(auVar35,auVar51);
        auVar42 = vsubps_avx(auVar35,auVar55);
        auVar35 = vmaxps_avx(auVar56,auVar40);
        auVar35 = vminps_avx(auVar35,auVar53);
        auVar35 = vsubps_avx(auVar35,auVar56);
        tNear.field_0.v[1] =
             auVar35._4_4_ * auVar35._4_4_ +
             auVar42._4_4_ * auVar42._4_4_ + auVar19._4_4_ * auVar19._4_4_;
        tNear.field_0.v[0] =
             auVar35._0_4_ * auVar35._0_4_ +
             auVar42._0_4_ * auVar42._0_4_ + auVar19._0_4_ * auVar19._0_4_;
        tNear.field_0.v[2] =
             auVar35._8_4_ * auVar35._8_4_ +
             auVar42._8_4_ * auVar42._8_4_ + auVar19._8_4_ * auVar19._8_4_;
        tNear.field_0.v[3] =
             auVar35._12_4_ * auVar35._12_4_ +
             auVar42._12_4_ * auVar42._12_4_ + auVar19._12_4_ * auVar19._12_4_;
        auVar35 = vcmpps_avx(auVar43,auVar48,2);
        auVar19 = vcmpps_avx(auVar51,auVar33,5);
        auVar35 = vandps_avx(auVar35,auVar19);
        auVar19._4_4_ = fVar1 + fVar11;
        auVar19._0_4_ = fVar1 + fVar10;
        auVar19._8_4_ = fVar1 + fVar12;
        auVar19._12_4_ = fVar1 + fVar13;
        auVar19 = vcmpps_avx(auVar43,auVar19,2);
        auVar20._4_4_ = fVar2 + auVar37._4_4_;
        auVar20._0_4_ = fVar2 + auVar37._0_4_;
        auVar20._8_4_ = fVar2 + auVar37._8_4_;
        auVar20._12_4_ = fVar2 + auVar37._12_4_;
        auVar42 = vcmpps_avx(auVar46,auVar20,2);
        auVar19 = vandps_avx(auVar42,auVar19);
        auVar42 = vcmpps_avx(auVar53,auVar18,5);
        auVar35 = vandps_avx(auVar35,auVar42);
        auVar42 = vcmpps_avx(auVar48,auVar17,5);
        auVar39 = vcmpps_avx(auVar40,auVar38,2);
        auVar42 = vandps_avx(auVar39,auVar42);
        auVar19 = vandps_avx(auVar19,auVar42);
        auVar35 = vandps_avx(auVar19,auVar35);
        if ((uVar26 & 7) == 6) {
LAB_00b6bcbd:
          auVar19 = vcmpps_avx(*(undefined1 (*) [16])((uVar31 & 0xfffffffffffffff0) + 0xe0),auVar34,
                               2);
          auVar42 = vcmpps_avx(auVar34,*(undefined1 (*) [16])((uVar31 & 0xfffffffffffffff0) + 0xf0),
                               1);
          auVar19 = vandps_avx(auVar19,auVar42);
          auVar35 = vandps_avx(auVar19,auVar35);
          auVar35 = vpslld_avx(auVar35,0x1f);
        }
        else {
          auVar35 = vpslld_avx(auVar35,0x1f);
        }
        uVar26 = vmovmskps_avx(auVar35);
LAB_00b6bb70:
        if (uVar26 != 0) {
          uVar25 = uVar31 & 0xfffffffffffffff0;
          lVar27 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          uVar31 = *(ulong *)(uVar25 + lVar27 * 8);
          uVar26 = uVar26 - 1 & uVar26;
          if (uVar26 != 0) {
            uVar7 = *(uint *)(local_1048 + lVar27 * 4 + -0x10);
            lVar27 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar25 + lVar27 * 8);
            uVar8 = *(uint *)(local_1048 + lVar27 * 4 + -0x10);
            uVar26 = uVar26 - 1 & uVar26;
            if (uVar26 == 0) {
              if (uVar7 < uVar8) {
                (pSVar28->ptr).ptr = uVar9;
                pSVar28->dist = uVar8;
                pSVar28 = pSVar28 + 1;
              }
              else {
                (pSVar28->ptr).ptr = uVar31;
                pSVar28->dist = uVar7;
                pSVar28 = pSVar28 + 1;
                uVar31 = uVar9;
              }
            }
            else {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar31;
              auVar35 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar7));
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar9;
              auVar19 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar8));
              lVar27 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *(ulong *)(uVar25 + lVar27 * 8);
              auVar34 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_1048 + lVar27 * 4 + -0x10)))
              ;
              auVar42 = vpcmpgtd_avx(auVar19,auVar35);
              uVar26 = uVar26 - 1 & uVar26;
              if (uVar26 == 0) {
                auVar39 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar19,auVar35,auVar39);
                auVar35 = vblendvps_avx(auVar35,auVar19,auVar39);
                auVar19 = vpcmpgtd_avx(auVar34,auVar42);
                auVar39 = vpshufd_avx(auVar19,0xaa);
                auVar19 = vblendvps_avx(auVar34,auVar42,auVar39);
                auVar42 = vblendvps_avx(auVar42,auVar34,auVar39);
                auVar34 = vpcmpgtd_avx(auVar42,auVar35);
                auVar34 = vpshufd_avx(auVar34,0xaa);
                SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar42,auVar35,auVar34);
                SVar15 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar35,auVar42,auVar34);
                *pSVar28 = SVar15;
                pSVar28[1] = SVar14;
                uVar31 = auVar19._0_8_;
                pSVar28 = pSVar28 + 2;
              }
              else {
                lVar27 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *(ulong *)(uVar25 + lVar27 * 8);
                auVar45 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_1048 + lVar27 * 4 + -0x10)
                                                         ));
                auVar39 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar19,auVar35,auVar39);
                auVar35 = vblendvps_avx(auVar35,auVar19,auVar39);
                auVar19 = vpcmpgtd_avx(auVar45,auVar34);
                auVar39 = vpshufd_avx(auVar19,0xaa);
                auVar19 = vblendvps_avx(auVar45,auVar34,auVar39);
                auVar34 = vblendvps_avx(auVar34,auVar45,auVar39);
                auVar39 = vpcmpgtd_avx(auVar34,auVar35);
                auVar45 = vpshufd_avx(auVar39,0xaa);
                auVar39 = vblendvps_avx(auVar34,auVar35,auVar45);
                SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar35,auVar34,auVar45);
                auVar35 = vpcmpgtd_avx(auVar19,auVar42);
                auVar34 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar19,auVar42,auVar34);
                auVar19 = vblendvps_avx(auVar42,auVar19,auVar34);
                auVar42 = vpcmpgtd_avx(auVar39,auVar19);
                auVar42 = vpshufd_avx(auVar42,0xaa);
                SVar15 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar39,auVar19,auVar42);
                SVar16 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar19,auVar39,auVar42);
                *pSVar28 = SVar14;
                pSVar28[1] = SVar16;
                pSVar28[2] = SVar15;
                uVar31 = auVar35._0_8_;
                pSVar28 = pSVar28 + 3;
              }
            }
          }
          goto LAB_00b6ba9e;
        }
        goto LAB_00b6ba80;
      }
      if ((uVar31 & 8) == 0) {
        uVar25 = uVar31 & 0xfffffffffffffff0;
        fVar5 = query->time;
        auVar34._4_4_ = fVar5;
        auVar34._0_4_ = fVar5;
        auVar34._8_4_ = fVar5;
        auVar34._12_4_ = fVar5;
        auVar39._0_4_ = fVar5 * *(float *)(uVar25 + 0x80) + *(float *)(uVar25 + 0x20);
        auVar39._4_4_ = fVar5 * *(float *)(uVar25 + 0x84) + *(float *)(uVar25 + 0x24);
        auVar39._8_4_ = fVar5 * *(float *)(uVar25 + 0x88) + *(float *)(uVar25 + 0x28);
        auVar39._12_4_ = fVar5 * *(float *)(uVar25 + 0x8c) + *(float *)(uVar25 + 0x2c);
        auVar42._0_4_ = fVar5 * *(float *)(uVar25 + 0xa0) + *(float *)(uVar25 + 0x40);
        auVar42._4_4_ = fVar5 * *(float *)(uVar25 + 0xa4) + *(float *)(uVar25 + 0x44);
        auVar42._8_4_ = fVar5 * *(float *)(uVar25 + 0xa8) + *(float *)(uVar25 + 0x48);
        auVar42._12_4_ = fVar5 * *(float *)(uVar25 + 0xac) + *(float *)(uVar25 + 0x4c);
        auVar45._0_4_ = fVar5 * *(float *)(uVar25 + 0xc0) + *(float *)(uVar25 + 0x60);
        auVar45._4_4_ = fVar5 * *(float *)(uVar25 + 0xc4) + *(float *)(uVar25 + 100);
        auVar45._8_4_ = fVar5 * *(float *)(uVar25 + 200) + *(float *)(uVar25 + 0x68);
        auVar45._12_4_ = fVar5 * *(float *)(uVar25 + 0xcc) + *(float *)(uVar25 + 0x6c);
        auVar47._0_4_ = fVar5 * *(float *)(uVar25 + 0x90) + *(float *)(uVar25 + 0x30);
        auVar47._4_4_ = fVar5 * *(float *)(uVar25 + 0x94) + *(float *)(uVar25 + 0x34);
        auVar47._8_4_ = fVar5 * *(float *)(uVar25 + 0x98) + *(float *)(uVar25 + 0x38);
        auVar47._12_4_ = fVar5 * *(float *)(uVar25 + 0x9c) + *(float *)(uVar25 + 0x3c);
        auVar50._0_4_ = fVar5 * *(float *)(uVar25 + 0xb0) + *(float *)(uVar25 + 0x50);
        auVar50._4_4_ = fVar5 * *(float *)(uVar25 + 0xb4) + *(float *)(uVar25 + 0x54);
        auVar50._8_4_ = fVar5 * *(float *)(uVar25 + 0xb8) + *(float *)(uVar25 + 0x58);
        auVar50._12_4_ = fVar5 * *(float *)(uVar25 + 0xbc) + *(float *)(uVar25 + 0x5c);
        auVar52._0_4_ = fVar5 * *(float *)(uVar25 + 0xd0) + *(float *)(uVar25 + 0x70);
        auVar52._4_4_ = fVar5 * *(float *)(uVar25 + 0xd4) + *(float *)(uVar25 + 0x74);
        auVar52._8_4_ = fVar5 * *(float *)(uVar25 + 0xd8) + *(float *)(uVar25 + 0x78);
        auVar52._12_4_ = fVar5 * *(float *)(uVar25 + 0xdc) + *(float *)(uVar25 + 0x7c);
        auVar35 = vmaxps_avx(auVar54,auVar39);
        auVar35 = vminps_avx(auVar35,auVar47);
        auVar19 = vsubps_avx(auVar35,auVar54);
        auVar35 = vmaxps_avx(auVar55,auVar42);
        auVar35 = vminps_avx(auVar35,auVar50);
        auVar42 = vsubps_avx(auVar35,auVar55);
        auVar35 = vmaxps_avx(auVar56,auVar45);
        auVar35 = vminps_avx(auVar35,auVar52);
        auVar35 = vsubps_avx(auVar35,auVar56);
        tNear.field_0.v[0] =
             auVar19._0_4_ * auVar19._0_4_ + auVar42._0_4_ * auVar42._0_4_ +
             auVar35._0_4_ * auVar35._0_4_;
        tNear.field_0.v[1] =
             auVar19._4_4_ * auVar19._4_4_ + auVar42._4_4_ * auVar42._4_4_ +
             auVar35._4_4_ * auVar35._4_4_;
        tNear.field_0.v[2] =
             auVar19._8_4_ * auVar19._8_4_ + auVar42._8_4_ * auVar42._8_4_ +
             auVar35._8_4_ * auVar35._8_4_;
        tNear.field_0.v[3] =
             auVar19._12_4_ * auVar19._12_4_ + auVar42._12_4_ * auVar42._12_4_ +
             auVar35._12_4_ * auVar35._12_4_;
        auVar35 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar57,2);
        auVar19 = vcmpps_avx(auVar39,auVar47,2);
        auVar35 = vandps_avx(auVar35,auVar19);
        if ((uVar26 & 7) == 6) goto LAB_00b6bcbd;
        uVar26 = vmovmskps_avx(auVar35);
        goto LAB_00b6bb70;
      }
LAB_00b6be8e:
      lVar32 = (uVar31 & 0xfffffffffffffff0) + 0x130;
      bVar23 = 0;
      for (lVar27 = 0; lVar27 != (ulong)(uVar26 & 0xf) - 8; lVar27 = lVar27 + 1) {
        bVar29 = 0;
        for (lVar30 = -0x10; lVar30 != 0; lVar30 = lVar30 + 4) {
          uVar7 = *(uint *)(lVar32 + lVar30);
          if ((ulong)uVar7 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar7].ptr;
          context->geomID = uVar7;
          context->primID = *(uint *)(lVar32 + 0x10 + lVar30);
          bVar22 = Geometry::pointQuery(this,query,context);
          bVar29 = bVar29 | bVar22;
        }
        bVar23 = bVar23 | bVar29;
        lVar32 = lVar32 + 0x140;
      }
    } while (bVar23 == 0);
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar33._4_4_ = uVar4;
    auVar33._0_4_ = uVar4;
    auVar33._8_4_ = uVar4;
    auVar33._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar37._4_4_ = uVar4;
    auVar37._0_4_ = uVar4;
    auVar37._8_4_ = uVar4;
    auVar37._12_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar35._4_4_ = uVar4;
    auVar35._0_4_ = uVar4;
    auVar35._8_4_ = uVar4;
    auVar35._12_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    }
    bVar24 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }